

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O3

void __thiscall TextFile::bufPut(TextFile *this,char c)

{
  ulong uVar1;
  
  if (this->mode == Write) {
    uVar1 = this->bufPos;
    if (0xfff < uVar1) {
      std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                           field_0x10,(long)(this->buf)._M_dataplus._M_p);
      uVar1 = 0;
    }
    this->bufPos = uVar1 + 1;
    (this->buf)._M_dataplus._M_p[uVar1] = c;
    return;
  }
  __assert_fail("mode == Write",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Util/FileClasses.cpp"
                ,0x3a3,"void TextFile::bufPut(const char)");
}

Assistant:

void TextFile::bufPut(const char c)
{
	assert(mode == Write);

	if (bufPos >= TEXTFILE_BUF_MAX_SIZE)
		bufDrainWrite();

	buf[bufPos++] = c;
}